

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O0

void checkValidDateTime(QDateTimeData *d,TransitionResolution resolve)

{
  TimeSpec TVar1;
  QFlagsStorage<QDateTimePrivate::TransitionOption> in_ESI;
  long in_FS_OFFSET;
  TimeSpec spec;
  QFlagsStorage<QDateTimePrivate::StatusFlag> in_stack_ffffffffffffffac;
  TransitionResolution in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  QTimeZone *zone;
  undefined4 in_stack_ffffffffffffffcc;
  QTimeZone local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  getStatus((QDateTimeData *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  TVar1 = extractSpec((StatusFlags)in_stack_ffffffffffffffac.i);
  if (TVar1 != LocalTime) {
    if (TVar1 - UTC < 2) {
      refreshSimpleDateTime
                ((QDateTimeData *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
      goto LAB_0056f67d;
    }
    if (TVar1 != TimeZone) goto LAB_0056f67d;
  }
  zone = &local_10;
  QDateTime::Data::timeZone((Data *)CONCAT44(in_stack_ffffffffffffffcc,TVar1));
  toTransitionOptions(in_stack_ffffffffffffffb0);
  refreshZonedDateTime
            ((QDateTimeData *)CONCAT44(in_stack_ffffffffffffffcc,TVar1),zone,
             (TransitionOptions)in_ESI.i);
  QTimeZone::~QTimeZone((QTimeZone *)0x56f65d);
LAB_0056f67d:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void checkValidDateTime(QDateTimeData &d, QDateTime::TransitionResolution resolve)
{
    auto spec = extractSpec(getStatus(d));
    switch (spec) {
    case Qt::OffsetFromUTC:
    case Qt::UTC:
        // for these, a valid date and a valid time imply a valid QDateTime
        refreshSimpleDateTime(d);
        break;
    case Qt::TimeZone:
    case Qt::LocalTime:
        // For these, we need to check whether (the zone is valid and) the time
        // is valid for the zone. Expensive, but we have no other option.
        refreshZonedDateTime(d, d.timeZone(), toTransitionOptions(resolve));
        break;
    }
}